

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.cc
# Opt level: O1

int pkcs7_parse_header(uint8_t **der_bytes,CBS *out,CBS *cbs)

{
  int iVar1;
  int line;
  CBS signed_data;
  uint64_t version;
  CBS content_info;
  CBS wrapped_signed_data;
  CBS content_type;
  CBS in;
  CBS local_68;
  uint64_t local_58;
  CBS local_50;
  CBS local_40;
  CBS local_30;
  CBS local_20;
  
  *der_bytes = (uint8_t *)0x0;
  iVar1 = CBS_asn1_ber_to_der(cbs,&local_20,der_bytes);
  if (((iVar1 != 0) && (iVar1 = CBS_get_asn1(&local_20,&local_50,0x20000010), iVar1 != 0)) &&
     (iVar1 = CBS_get_asn1(&local_50,&local_30,6), iVar1 != 0)) {
    iVar1 = CBS_mem_equal(&local_30,kPKCS7SignedData,9);
    if (iVar1 == 0) {
      iVar1 = 0x65;
      line = 0x3a;
    }
    else {
      iVar1 = CBS_get_asn1(&local_50,&local_40,0xa0000000);
      if (((iVar1 == 0) || (iVar1 = CBS_get_asn1(&local_40,&local_68,0x20000010), iVar1 == 0)) ||
         ((iVar1 = CBS_get_asn1_uint64(&local_68,&local_58), iVar1 == 0 ||
          ((iVar1 = CBS_get_asn1(&local_68,(CBS *)0x0,0x20000011), iVar1 == 0 ||
           (iVar1 = CBS_get_asn1(&local_68,(CBS *)0x0,0x20000010), iVar1 == 0))))))
      goto LAB_0031e49c;
      if (local_58 != 0) {
        out->data = local_68.data;
        out->len = local_68.len;
        return 1;
      }
      iVar1 = 100;
      line = 0x49;
    }
    ERR_put_error(0x12,0,iVar1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7.cc"
                  ,line);
  }
LAB_0031e49c:
  OPENSSL_free(*der_bytes);
  *der_bytes = (uint8_t *)0x0;
  return 0;
}

Assistant:

int pkcs7_parse_header(uint8_t **der_bytes, CBS *out, CBS *cbs) {
  CBS in, content_info, content_type, wrapped_signed_data, signed_data;
  uint64_t version;

  // The input may be in BER format.
  *der_bytes = NULL;
  if (!CBS_asn1_ber_to_der(cbs, &in, der_bytes) ||
      // See https://tools.ietf.org/html/rfc2315#section-7
      !CBS_get_asn1(&in, &content_info, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1(&content_info, &content_type, CBS_ASN1_OBJECT)) {
    goto err;
  }

  if (!CBS_mem_equal(&content_type, kPKCS7SignedData,
                     sizeof(kPKCS7SignedData))) {
    OPENSSL_PUT_ERROR(PKCS7, PKCS7_R_NOT_PKCS7_SIGNED_DATA);
    goto err;
  }

  // See https://tools.ietf.org/html/rfc2315#section-9.1
  if (!CBS_get_asn1(&content_info, &wrapped_signed_data,
                    CBS_ASN1_CONTEXT_SPECIFIC | CBS_ASN1_CONSTRUCTED | 0) ||
      !CBS_get_asn1(&wrapped_signed_data, &signed_data, CBS_ASN1_SEQUENCE) ||
      !CBS_get_asn1_uint64(&signed_data, &version) ||
      !CBS_get_asn1(&signed_data, NULL /* digests */, CBS_ASN1_SET) ||
      !CBS_get_asn1(&signed_data, NULL /* content */, CBS_ASN1_SEQUENCE)) {
    goto err;
  }

  if (version < 1) {
    OPENSSL_PUT_ERROR(PKCS7, PKCS7_R_BAD_PKCS7_VERSION);
    goto err;
  }

  CBS_init(out, CBS_data(&signed_data), CBS_len(&signed_data));
  return 1;

err:
  OPENSSL_free(*der_bytes);
  *der_bytes = NULL;
  return 0;
}